

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

void __thiscall HEkkDual::improveChooseColumnRow(HEkkDual *this,HVector *row_ep)

{
  HEkkDualRow *in_RDI;
  HVector *in_stack_00000020;
  HighsInt in_stack_0000002c;
  HEkk *in_stack_00000030;
  bool quad_precision;
  bool debug_rows_report;
  HighsInt debug_price_report;
  bool debug_price_report_on;
  HighsLp *lp;
  allocator *in_stack_fffffffffffffee8;
  HighsSimplexAnalysis *in_stack_fffffffffffffef0;
  HEkkDualRow *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff10;
  HighsInt offset;
  HVector *in_stack_ffffffffffffff18;
  HVector *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  HighsInt in_stack_ffffffffffffff34;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  HEkk *in_stack_ffffffffffffff40;
  allocator local_a9;
  string local_a8 [38];
  undefined1 local_82;
  allocator local_81;
  string local_80 [55];
  undefined1 local_49 [40];
  byte local_21;
  undefined4 local_20;
  undefined1 local_19;
  HighsInt *local_18;
  
  offset = (HighsInt)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  local_18 = in_RDI->workNumTotPermutation + 0x866;
  local_19 = 0;
  local_20 = 0xfffffffe;
  local_21 = 0;
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  HEkkDualRow::deleteFreemove(in_stack_ffffffffffffff00);
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  if ((local_21 & 1) != 0) {
    offset = (HighsInt)((ulong)(in_RDI->workNumTotPermutation + 0xace) >> 0x20);
    in_stack_ffffffffffffff18 = (HVector *)local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_49 + 1),"Row e_p.0",(allocator *)in_stack_ffffffffffffff18);
    HSimplexNla::reportArray
              ((HSimplexNla *)in_stack_ffffffffffffff40,
               (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,SUB81((ulong)in_RDI >> 0x38,0));
    std::__cxx11::string::~string((string *)(local_49 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  HEkk::unitBtranIterativeRefinement(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  if ((local_21 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Row e_p.1",&local_81);
    HSimplexNla::reportArray
              ((HSimplexNla *)in_stack_ffffffffffffff40,
               (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,SUB81((ulong)in_RDI >> 0x38,0));
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  local_82 = 1;
  HEkk::tableauRowPrice
            (in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f,
             (HVector *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,(HighsInt)((ulong)in_RDI >> 0x20));
  if ((local_21 & 1) != 0) {
    in_stack_fffffffffffffef0 = (HighsSimplexAnalysis *)(in_RDI->workNumTotPermutation + 0xace);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"Row a_p",&local_a9);
    HSimplexNla::reportArray
              ((HSimplexNla *)in_stack_ffffffffffffff40,
               (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,SUB81((ulong)in_RDI >> 0x38,0));
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    in_stack_fffffffffffffee8 = (allocator *)&stack0xffffffffffffff2f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff30,"Row e_p",in_stack_fffffffffffffee8);
    HSimplexNla::reportArray
              ((HSimplexNla *)in_stack_ffffffffffffff40,
               (string *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38),
               in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,SUB81((ulong)in_RDI >> 0x38,0));
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff2f);
  }
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  HEkkDualRow::clear((HEkkDualRow *)
                     &in_RDI[4].packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  in_RDI[4].sorted_workData.
  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)in_RDI[5].alt_workGroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  HEkkDualRow::createFreemove
            ((HEkkDualRow *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  HighsSimplexAnalysis::simplexTimerStart
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  HEkkDualRow::chooseMakepack(in_RDI,in_stack_ffffffffffffff18,offset);
  HEkkDualRow::chooseMakepack(in_RDI,in_stack_ffffffffffffff18,offset);
  HighsSimplexAnalysis::simplexTimerStop
            (in_stack_fffffffffffffef0,(HighsInt)((ulong)in_stack_fffffffffffffee8 >> 0x20),
             (HighsInt)in_stack_fffffffffffffee8);
  return;
}

Assistant:

void HEkkDual::improveChooseColumnRow(HVector* row_ep) {
  HighsLp& lp = ekk_instance_.lp_;
  const bool debug_price_report_on = false;
  HighsInt debug_price_report = kDebugReportOff;
  bool debug_rows_report = false;
  if (ekk_instance_.debug_iteration_report_) {
    if (debug_price_report_on) debug_price_report = kDebugReportAll;
    debug_rows_report = debug_price_report_on;
    if (debug_price_report != kDebugReportOff)
      printf("HEkkDual::chooseColumn Check iter = %d\n",
             (int)ekk_instance_.iteration_count_);
  }

  analysis->simplexTimerStart(Chuzc5Clock);
  dualRow.deleteFreemove();
  analysis->simplexTimerStop(Chuzc5Clock);

  if (debug_rows_report)
    ekk_instance_.simplex_nla_.reportArray("Row e_p.0", lp.num_col_, row_ep,
                                           true);
  ekk_instance_.unitBtranIterativeRefinement(row_out, *row_ep);
  if (debug_rows_report)
    ekk_instance_.simplex_nla_.reportArray("Row e_p.1", lp.num_col_, row_ep,
                                           true);

  const bool quad_precision = true;
  ekk_instance_.tableauRowPrice(quad_precision, *row_ep, row_ap,
                                debug_price_report);
  if (debug_rows_report) {
    ekk_instance_.simplex_nla_.reportArray("Row a_p", 0, &row_ap, true);
    ekk_instance_.simplex_nla_.reportArray("Row e_p", lp.num_col_, row_ep,
                                           true);
  }
  analysis->simplexTimerStart(Chuzc0Clock);
  dualRow.clear();
  dualRow.workDelta = delta_primal;
  dualRow.createFreemove(row_ep);
  analysis->simplexTimerStop(Chuzc0Clock);
  //
  // Section 1: Pack row_ap and row_ep
  analysis->simplexTimerStart(Chuzc1Clock);
  // Pack row_ap into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(&row_ap, 0);
  // Pack row_ep into the packIndex/Value of HEkkDualRow
  dualRow.chooseMakepack(row_ep, solver_num_col);
  analysis->simplexTimerStop(Chuzc1Clock);
}